

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posixcrashhandler.cpp
# Opt level: O0

void __thiscall
Debug::PosixCrashHandler::setup(PosixCrashHandler *this,string *appName,string *crashDirPath)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  ostream *poVar4;
  bool bVar5;
  string local_2c8 [32];
  tm local_2a8;
  stringstream local_270 [8];
  stringstream s;
  ostream local_260 [392];
  string local_d8 [8];
  string path;
  sigaction sa;
  string *crashDirPath_local;
  string *appName_local;
  PosixCrashHandler *this_local;
  
  path.field_2._8_8_ = posixSignalHandler;
  sa.sa_restorer = (_func_void *)crashDirPath;
  sigemptyset((sigset_t *)&sa);
  sa.sa_mask.__val[0xf]._0_4_ = 0x8000004;
  sigaction(6,(sigaction *)((long)&path.field_2 + 8),(sigaction *)0x0);
  sigaction(0xb,(sigaction *)((long)&path.field_2 + 8),(sigaction *)0x0);
  sigaction(7,(sigaction *)((long)&path.field_2 + 8),(sigaction *)0x0);
  sigaction(4,(sigaction *)((long)&path.field_2 + 8),(sigaction *)0x0);
  sigaction(8,(sigaction *)((long)&path.field_2 + 8),(sigaction *)0x0);
  sigaction(0xd,(sigaction *)((long)&path.field_2 + 8),(sigaction *)0x0);
  sigaction(0xf,(sigaction *)((long)&path.field_2 + 8),(sigaction *)0x0);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string(local_d8,(string *)sa.sa_restorer);
    while( true ) {
      uVar1 = std::__cxx11::string::size();
      bVar5 = false;
      if (1 < uVar1) {
        std::__cxx11::string::size();
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_d8);
        bVar5 = *pcVar2 == '/';
      }
      if (!bVar5) break;
      lVar3 = std::__cxx11::string::size();
      std::__cxx11::string::erase((ulong)local_d8,lVar3 - 1);
    }
    std::__cxx11::stringstream::stringstream(local_270);
    poVar4 = std::operator<<(local_260,local_d8);
    poVar4 = std::operator<<(poVar4,"/");
    poVar4 = std::operator<<(poVar4,(string *)appName);
    std::operator<<(poVar4,"_");
    now();
    formatDateTime(local_260,&local_2a8,"%Y%m%d_%H%M%S");
    std::operator<<(local_260,".bktr");
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=((string *)&this->m_backtraceFilePath,local_2c8);
    std::__cxx11::string::~string(local_2c8);
    std::__cxx11::stringstream::~stringstream(local_270);
    std::__cxx11::string::~string(local_d8);
  }
  return;
}

Assistant:

void PosixCrashHandler::setup(const std::string &appName, const std::string &crashDirPath) {
        struct sigaction sa;
        sa.sa_sigaction = posixSignalHandler;
        sigemptyset( &sa.sa_mask );

#ifdef __APPLE__
        /* for some reason we backtrace() doesn't work on osx
       when we use an alternate stack */
        sa.sa_flags = SA_SIGINFO;
#else
        sa.sa_flags = SA_SIGINFO | SA_ONSTACK;
#endif

        sigaction( SIGABRT, &sa, NULL );
        sigaction( SIGSEGV, &sa, NULL );
        sigaction( SIGBUS,  &sa, NULL );
        sigaction( SIGILL,  &sa, NULL );
        sigaction( SIGFPE,  &sa, NULL );
        sigaction( SIGPIPE, &sa, NULL );
        sigaction( SIGTERM, &sa, NULL );

        if (!crashDirPath.empty()) {
            std::string path = crashDirPath;
            while ((path.size() > 1) &&
                   (path[path.size() - 1] == '/')) {
                path.erase(path.size() - 1);
            }

            std::stringstream s;
            s << path << "/" << appName << "_";
            formatDateTime(s, now(), CHILLOUT_DATETIME);
            s << ".bktr";
            m_backtraceFilePath = s.str();
        }
    }